

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void scan_past_frames(FrameWindowBuffer *buffer,int num_frames_to_scan,AV1LevelSpec *level_spec,
                     AV1LevelStats *level_stats)

{
  int iVar1;
  int local_98;
  int local_8c;
  int local_88;
  int local_7c;
  FrameRecord *local_78;
  int64_t local_70;
  int local_64;
  int local_60;
  int local_4c;
  long local_48;
  FrameRecord *record;
  long lStack_38;
  int i;
  size_t encoded_size_in_bytes;
  int64_t decoded_samples;
  int64_t display_samples;
  int tiles;
  int frame_headers;
  int index;
  int num_frames_in_buffer;
  AV1LevelStats *level_stats_local;
  
  iVar1 = buffer->num;
  decoded_samples._0_4_ = (buffer->start + iVar1 + -1) % 0x100;
  encoded_size_in_bytes._4_4_ = 0;
  encoded_size_in_bytes._0_4_ = 0;
  lStack_38 = 0;
  record = (FrameRecord *)0x0;
  local_48 = 0;
  local_4c = 0;
  while( true ) {
    local_60 = num_frames_to_scan;
    if (iVar1 < num_frames_to_scan) {
      local_60 = iVar1;
    }
    if (local_60 <= local_4c) break;
    if (buffer->buf[(int)decoded_samples].show_existing_frame == 0) {
      encoded_size_in_bytes._4_4_ =
           buffer->buf[(int)decoded_samples].frame_header_count + encoded_size_in_bytes._4_4_;
      record = (FrameRecord *)
               ((long)&record->ts_start + (long)buffer->buf[(int)decoded_samples].pic_size);
    }
    if (buffer->buf[(int)decoded_samples].show_frame != 0) {
      lStack_38 = buffer->buf[(int)decoded_samples].pic_size + lStack_38;
    }
    encoded_size_in_bytes._0_4_ =
         buffer->buf[(int)decoded_samples].tiles + (int)encoded_size_in_bytes;
    local_48 = buffer->buf[(int)decoded_samples].encoded_size_in_bytes + local_48;
    decoded_samples._0_4_ = (int)decoded_samples + -1;
    if ((int)decoded_samples < 0) {
      decoded_samples._0_4_ = 0xff;
    }
    local_4c = local_4c + 1;
  }
  if (encoded_size_in_bytes._4_4_ < level_spec->max_header_rate) {
    local_64 = level_spec->max_header_rate;
  }
  else {
    local_64 = encoded_size_in_bytes._4_4_;
  }
  level_spec->max_header_rate = local_64;
  if (lStack_38 < level_spec->max_display_rate) {
    local_70 = level_spec->max_display_rate;
  }
  else {
    local_70 = lStack_38;
  }
  level_spec->max_display_rate = local_70;
  if ((long)record < level_spec->max_decode_rate) {
    local_78 = (FrameRecord *)level_spec->max_decode_rate;
  }
  else {
    local_78 = record;
  }
  level_spec->max_decode_rate = (int64_t)local_78;
  if ((int)encoded_size_in_bytes < level_spec->max_tile_rate) {
    local_7c = level_spec->max_tile_rate;
  }
  else {
    local_7c = (int)encoded_size_in_bytes;
  }
  level_spec->max_tile_rate = local_7c;
  if ((ulong)(local_48 << 3) < 0x7fffffff) {
    local_88 = (int)(local_48 << 3);
  }
  else {
    local_88 = 0x7fffffff;
  }
  if (local_88 < level_stats->max_bitrate) {
    local_8c = level_stats->max_bitrate;
  }
  else {
    if ((ulong)(local_48 << 3) < 0x7fffffff) {
      local_98 = (int)(local_48 << 3);
    }
    else {
      local_98 = 0x7fffffff;
    }
    local_8c = local_98;
  }
  level_stats->max_bitrate = local_8c;
  return;
}

Assistant:

static void scan_past_frames(const FrameWindowBuffer *const buffer,
                             int num_frames_to_scan,
                             AV1LevelSpec *const level_spec,
                             AV1LevelStats *const level_stats) {
  const int num_frames_in_buffer = buffer->num;
  int index = (buffer->start + num_frames_in_buffer - 1) % FRAME_WINDOW_SIZE;
  int frame_headers = 0;
  int tiles = 0;
  int64_t display_samples = 0;
  int64_t decoded_samples = 0;
  size_t encoded_size_in_bytes = 0;
  for (int i = 0; i < AOMMIN(num_frames_in_buffer, num_frames_to_scan); ++i) {
    const FrameRecord *const record = &buffer->buf[index];
    if (!record->show_existing_frame) {
      frame_headers += record->frame_header_count;
      decoded_samples += record->pic_size;
    }
    if (record->show_frame) {
      display_samples += record->pic_size;
    }
    tiles += record->tiles;
    encoded_size_in_bytes += record->encoded_size_in_bytes;
    --index;
    if (index < 0) index = FRAME_WINDOW_SIZE - 1;
  }
  level_spec->max_header_rate =
      AOMMAX(level_spec->max_header_rate, frame_headers);
  // TODO(huisu): we can now compute max display rate with the decoder model, so
  // these couple of lines can be removed. Keep them here for a while for
  // debugging purpose.
  level_spec->max_display_rate =
      AOMMAX(level_spec->max_display_rate, display_samples);
  level_spec->max_decode_rate =
      AOMMAX(level_spec->max_decode_rate, decoded_samples);
  level_spec->max_tile_rate = AOMMAX(level_spec->max_tile_rate, tiles);
  level_stats->max_bitrate =
      AOMMAX(level_stats->max_bitrate,
             (int)AOMMIN(encoded_size_in_bytes * 8, (size_t)INT_MAX));
}